

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

void ResetLine(TidyPrintImpl *pprint)

{
  uint uVar1;
  int iVar2;
  int wrap;
  TidyIndent *ind;
  TidyPrintImpl *pprint_local;
  
  if (pprint->ixInd != 0) {
    iVar2 = pprint->indent[1].attrValStart;
    pprint->indent[0].spaces = pprint->indent[1].spaces;
    pprint->indent[0].attrValStart = iVar2;
    pprint->indent[0].attrStringStart = pprint->indent[1].attrStringStart;
    InitIndent(pprint->indent + 1);
  }
  if (pprint->wraphere == 0) {
    if (0 < pprint->indent[0].attrStringStart) {
      pprint->indent[0].attrStringStart = 0;
    }
    if (0 < pprint->indent[0].attrValStart) {
      pprint->indent[0].attrValStart = 0;
    }
  }
  else {
    uVar1 = pprint->wraphere;
    if ((int)uVar1 < pprint->indent[0].attrStringStart) {
      pprint->indent[0].attrStringStart = pprint->indent[0].attrStringStart - uVar1;
    }
    if ((int)uVar1 < pprint->indent[0].attrValStart) {
      pprint->indent[0].attrValStart = pprint->indent[0].attrValStart - uVar1;
    }
  }
  pprint->ixInd = 0;
  pprint->wraphere = 0;
  return;
}

Assistant:

static void ResetLine( TidyPrintImpl* pprint )
{
    TidyIndent* ind = pprint->indent + 0;
    if ( pprint->ixInd > 0 )
    {
        ind[0] = ind[1];
        InitIndent( &ind[1] );
    }

    if ( pprint->wraphere > 0 )
    {
        int wrap = (int) pprint->wraphere;
        if ( ind[0].attrStringStart > wrap )
            ind[0].attrStringStart -= wrap;
        if ( ind[0].attrValStart > wrap )
            ind[0].attrValStart -= wrap;
    }
    else
    {
        if ( ind[0].attrStringStart > 0 )
            ind[0].attrStringStart = 0;
        if ( ind[0].attrValStart > 0 )
            ind[0].attrValStart = 0;
    }
    pprint->wraphere = pprint->ixInd = 0;
}